

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O1

void __thiscall duckdb::QueryResult::~QueryResult(QueryResult *this)

{
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var1;
  pointer pcVar2;
  
  (this->super_BaseQueryResult)._vptr_BaseQueryResult = (_func_int **)&PTR__QueryResult_024a8240;
  _Var1._M_head_impl =
       (this->next).super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
       ._M_t.super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
       .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseQueryResult + 8))();
  }
  (this->next).super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t
  .super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
  super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = (QueryResult *)0x0;
  pcVar2 = (this->client_properties).time_zone._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->client_properties).time_zone.field_2) {
    operator_delete(pcVar2);
  }
  BaseQueryResult::~BaseQueryResult(&this->super_BaseQueryResult);
  return;
}

Assistant:

QueryResult::~QueryResult() {
}